

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

parameter_trie_ptr __thiscall
boost::runtime::cla::rt_cla_detail::parameter_trie::make_subtrie(parameter_trie *this,char c)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  iterator iVar3;
  parameter_trie *p;
  char in_DL;
  sp_counted_base *extraout_RDX;
  sp_counted_base *extraout_RDX_00;
  shared_count sVar4;
  undefined7 in_register_00000031;
  _Rb_tree<char,std::pair<char_const,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>,std::_Select1st<std::pair<char_const,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>,std::less<char>,std::allocator<std::pair<char_const,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>>
  *this_00;
  pair<std::_Rb_tree_iterator<std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>,_bool>
  pVar5;
  parameter_trie_ptr pVar6;
  char c_local;
  shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> local_58;
  pair<char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_> local_40;
  
  this_00 = (_Rb_tree<char,std::pair<char_const,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>,std::_Select1st<std::pair<char_const,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>,std::less<char>,std::allocator<std::pair<char_const,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>>
             *)CONCAT71(in_register_00000031,c);
  c_local = in_DL;
  iVar3 = std::
          _Rb_tree<char,_std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>,_std::_Select1st<std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>,_std::less<char>,_std::allocator<std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>_>
          ::find((_Rb_tree<char,_std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>,_std::_Select1st<std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>,_std::less<char>,_std::allocator<std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>_>
                  *)this_00,&c_local);
  sVar4.pi_ = extraout_RDX;
  if (iVar3._M_node == (_Base_ptr)(this_00 + 8)) {
    p = (parameter_trie *)operator_new(0x60);
    (p->m_subtrie)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (p->m_subtrie)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    p_Var1 = &(p->m_subtrie)._M_t._M_impl.super__Rb_tree_header;
    (p->m_subtrie)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (p->m_subtrie)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    (p->m_subtrie)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    (p->m_id_candidates).
    super__Vector_base<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (p->m_id_candidates).
    super__Vector_base<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (p->m_id_candidates).
    super__Vector_base<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (p->m_param_candidate).px = (element_type *)0x0;
    (p->m_param_candidate).pn.pi_ = (sp_counted_base *)0x0;
    p->m_has_final_candidate = false;
    shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::
    shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>(&local_58,p);
    local_40.first = c_local;
    local_40.second.px = local_58.px;
    local_40.second.pn.pi_ = local_58.pn.pi_;
    local_58.px = (element_type *)0x0;
    local_58.pn.pi_ = (sp_counted_base *)0x0;
    pVar5 = std::
            _Rb_tree<char,std::pair<char_const,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>,std::_Select1st<std::pair<char_const,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>,std::less<char>,std::allocator<std::pair<char_const,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>>
            ::
            _M_emplace_unique<std::pair<char,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>
                      (this_00,&local_40);
    iVar3._M_node = (_Base_ptr)pVar5.first._M_node;
    detail::shared_count::~shared_count(&local_40.second.pn);
    detail::shared_count::~shared_count(&local_58.pn);
    sVar4.pi_ = extraout_RDX_00;
  }
  *(_Base_ptr *)&(this->m_subtrie)._M_t._M_impl = iVar3._M_node[1]._M_parent;
  p_Var2 = iVar3._M_node[1]._M_left;
  *(_Base_ptr *)&(this->m_subtrie)._M_t._M_impl.super__Rb_tree_header._M_header = p_Var2;
  if (p_Var2 != (_Base_ptr)0x0) {
    LOCK();
    *(int *)&p_Var2->_M_parent = *(int *)&p_Var2->_M_parent + 1;
    UNLOCK();
  }
  pVar6.pn.pi_ = sVar4.pi_;
  pVar6.px = this;
  return pVar6;
}

Assistant:

parameter_trie_ptr  make_subtrie( char c )
    {
        trie_per_char::const_iterator it = m_subtrie.find( c );

        if( it == m_subtrie.end() )
            it = m_subtrie.insert( std::make_pair( c, parameter_trie_ptr( new parameter_trie ) ) ).first;

        return it->second;
    }